

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::LogSumExp::backward_impl
          (LogSumExp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if ((xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    Tensor::operator*(&local_b0,dEdf);
    Tensor::operator*(&local_90,dEdxi);
    if ((local_90.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value ==
         local_b0.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) &&
       (local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value ==
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
      uVar4 = local_90.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value *
              local_90.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value;
      uVar7 = uVar4;
      if ((((ulong)local_90.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data & 3) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_90.
                                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                          .
                                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                          .m_data >> 2) & 0x3fffffff) & 0xf),
         (long)uVar4 <= (long)uVar7)) {
        uVar7 = uVar4;
      }
      uVar2 = uVar4 - uVar7;
      uVar5 = uVar2 + 0xf;
      if (-1 < (long)uVar2) {
        uVar5 = uVar2;
      }
      if (0 < (long)uVar7) {
        uVar8 = 0;
        do {
          local_90.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data[uVar8] =
               local_90.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[uVar8] +
               local_b0.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      lVar3 = (uVar5 & 0xfffffffffffffff0) + uVar7;
      if (0xf < (long)uVar2) {
        do {
          auVar10 = vaddps_avx512f(*(undefined1 (*) [64])
                                    (local_90.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_data + uVar7),
                                   *(undefined1 (*) [64])
                                    (local_b0.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_data + uVar7));
          *(undefined1 (*) [64])
           (local_90.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data + uVar7) = auVar10;
          uVar7 = uVar7 + 0x10;
        } while ((long)uVar7 < lVar3);
      }
      if (lVar3 < (long)uVar4) {
        do {
          local_90.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data[lVar3] =
               local_90.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[lVar3] +
               local_b0.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (uVar4 - lVar3 != 0);
      }
      return;
    }
    pcVar6 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Functor = Eigen::internal::add_assign_op<float, float>]"
    ;
LAB_00179edb:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar6);
  }
  Tensor::operator*(&local_b0,dEdxi);
  Tensor::operator*(&local_90,
                    (xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[i]);
  Tensor::operator*(&local_50,fx);
  if ((local_90.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_50.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    Tensor::operator*(&local_70,dEdf);
    if ((local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value ==
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) &&
       (local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value ==
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
      if ((local_b0.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value ==
           local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value) &&
         (local_b0.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value ==
          local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) {
        uVar4 = local_b0.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value *
                local_b0.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value;
        uVar7 = uVar4;
        if ((((ulong)local_b0.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data & 3) == 0) &&
           (uVar7 = (ulong)(-((uint)((ulong)local_b0.
                                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                            .
                                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                            .m_data >> 2) & 0x3fffffff) & 0xf),
           (long)uVar4 <= (long)uVar7)) {
          uVar7 = uVar4;
        }
        uVar2 = uVar4 - uVar7;
        uVar5 = uVar2 + 0xf;
        if (-1 < (long)uVar2) {
          uVar5 = uVar2;
        }
        if (0 < (long)uVar7) {
          uVar8 = 0;
          do {
            auVar10._0_4_ =
                 expf(local_90.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[uVar8] -
                      local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[uVar8]);
            auVar10._4_60_ = extraout_var;
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_70.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[uVar8]),auVar10._0_16_,
                                     ZEXT416((uint)local_b0.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[uVar8]));
            local_b0.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data[uVar8] = auVar1._0_4_;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        lVar3 = (uVar5 & 0xfffffffffffffff0) + uVar7;
        if (0xf < (long)uVar2) {
          auVar10 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
          auVar11 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
          auVar12 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
          auVar13 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
          auVar14 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
          auVar15 = vbroadcastss_avx512f(ZEXT416(0x39506967));
          auVar16 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
          auVar17 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
          auVar18 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
          auVar19 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar20 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
          auVar21 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
          uVar8 = uVar7;
          do {
            auVar22 = vsubps_avx512f(*(undefined1 (*) [64])
                                      (local_90.
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                       .
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                       .m_data + uVar8),
                                     *(undefined1 (*) [64])
                                      (local_50.
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                       .
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                       .m_data + uVar8));
            auVar23 = vminps_avx512f(auVar22,auVar10);
            auVar23 = vmaxps_avx512f(auVar23,auVar11);
            auVar24 = vfmadd231ps_avx512f(auVar12,auVar23,auVar13);
            auVar24 = vrndscaleps_avx512f(auVar24,1);
            auVar23 = vfmadd231ps_avx512f(auVar23,auVar24,auVar14);
            auVar25 = vmulps_avx512f(auVar23,auVar23);
            auVar26 = vmulps_avx512f(auVar25,auVar23);
            auVar27 = vfmadd213ps_avx512f(auVar15,auVar23,auVar16);
            auVar28 = vfmadd213ps_avx512f(auVar17,auVar23,auVar18);
            auVar29 = vaddps_avx512f(auVar23,auVar19);
            auVar27 = vfmadd213ps_avx512f(auVar27,auVar23,auVar20);
            auVar23 = vfmadd213ps_avx512f(auVar28,auVar23,auVar12);
            auVar23 = vfmadd231ps_avx512f(auVar23,auVar26,auVar27);
            auVar23 = vfmadd213ps_avx512f(auVar23,auVar25,auVar29);
            auVar24 = vaddps_avx512f(auVar24,auVar21);
            auVar24 = vcvttps2dq_avx512f(auVar24);
            auVar24 = vpslld_avx512f(auVar24,0x17);
            auVar23 = vmulps_avx512f(auVar23,auVar24);
            auVar22 = vmaxps_avx512f(auVar22,auVar23);
            auVar22 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                           (local_70.
                                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                            .
                                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                            .m_data + uVar8),auVar22,
                                          *(undefined1 (*) [64])
                                           (local_b0.
                                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                            .
                                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                            .m_data + uVar8));
            *(undefined1 (*) [64])
             (local_b0.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data + uVar8) = auVar22;
            uVar8 = uVar8 + 0x10;
          } while ((long)uVar8 < lVar3);
        }
        if ((long)uVar4 <= lVar3) {
          return;
        }
        lVar3 = (long)uVar5 >> 4;
        lVar9 = 0;
        do {
          auVar11._0_4_ =
               expf(local_90.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data[uVar7 + lVar3 * 0x10 + lVar9] -
                    local_50.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data[uVar7 + lVar3 * 0x10 + lVar9]);
          auVar11._4_60_ = extraout_var_00;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_70.
                                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                 .
                                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                 .m_data[uVar7 + lVar3 * 0x10 + lVar9]),
                                   auVar11._0_16_,
                                   ZEXT416((uint)local_b0.
                                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                 .
                                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                 .m_data[uVar7 + lVar3 * 0x10 + lVar9]));
          local_b0.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data[uVar7 + lVar3 * 0x10 + lVar9] = auVar1._0_4_;
          lVar9 = lVar9 + 1;
        } while (uVar2 - (uVar5 & 0xfffffffffffffff0) != lVar9);
        return;
      }
      pcVar6 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, -1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>, const Eigen::ArrayWrapper<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
      ;
      goto LAB_00179edb;
    }
    pcVar6 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>, const Eigen::ArrayWrapper<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>, Rhs = const Eigen::ArrayWrapper<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>]"
    ;
  }
  else {
    pcVar6 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
    ;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar6);
}

Assistant:

void LogSumExp::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  if (xs.size() == 0) {
    *dEdxi += *dEdf;
    return;
  }
  // df/dx_i = 1/{sum_j exp(x_j)} * exp(x_i)}
  //         = 1/{exp f(x)} * exp(x_i)
  //         = exp(x_i - f(x))
  auto d = *dEdxi;
  d.array() += (**xs[i] - *fx).array().exp() * (*dEdf).array();
}